

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O1

FFSRecordType FFSnext_record_type(FFSFile ffsfile)

{
  FFSRecordType FVar1;
  
  while( true ) {
    FVar1 = next_record_type(ffsfile);
    if ((FVar1 & ~ffsfile->visible_items_bitmap) == 0) break;
    FFSconsume_next_item(ffsfile);
  }
  return FVar1;
}

Assistant:

FFSRecordType
FFSnext_record_type(FFSFile ffsfile)
{
    FFSRecordType next = next_record_type(ffsfile);
    while ((next & ffsfile->visible_items_bitmap) != next) {
	FFSconsume_next_item(ffsfile);
	next = next_record_type(ffsfile);
    }
    return next;
}